

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

int vm_new_pkg(VM *vm,uint64_t name)

{
  int iVar1;
  int iVar2;
  Package *pPVar3;
  
  iVar1 = vm->pkgs_capacity;
  if (iVar1 <= vm->pkgs_count) {
    vm->pkgs_capacity = iVar1 * 2;
    pPVar3 = (Package *)realloc(vm->pkgs,(long)iVar1 << 5);
    vm->pkgs = pPVar3;
  }
  pPVar3 = vm->pkgs;
  iVar1 = vm->pkgs_count;
  vm->pkgs_count = iVar1 + 1;
  pPVar3[iVar1].name = name;
  iVar2 = vm_new_fn(vm,iVar1);
  pPVar3[iVar1].main_fn = iVar2;
  return vm->pkgs_count + -1;
}

Assistant:

int vm_new_pkg(VM *vm, uint64_t name) {
	if (vm->pkgs_count >= vm->pkgs_capacity) {
		vm->pkgs_capacity *= 2;
		vm->pkgs = realloc(vm->pkgs, sizeof(Package) * vm->pkgs_capacity);
	}

	Package *pkg = &vm->pkgs[vm->pkgs_count++];
	pkg->name = name;
	pkg->main_fn = vm_new_fn(vm, vm->pkgs_count - 1);
	return vm->pkgs_count - 1;
}